

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq_Pos_Table.cpp
# Opt level: O2

void __thiscall Eq_Pos_Table::Eq_Pos_Table(Eq_Pos_Table *this)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int unaff_R15D;
  initializer_list<Position> __l;
  initializer_list<Position> __l_00;
  initializer_list<Position> __l_01;
  initializer_list<Position> __l_02;
  initializer_list<Position> __l_03;
  allocator_type local_cd;
  int local_cc;
  Position local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  ulong local_a0;
  int local_94;
  int local_90;
  int local_8c;
  Position local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
  *local_70;
  vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
  *local_68;
  vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
  *local_60;
  Eq_Pos_Table *local_58;
  ulong local_50;
  vector<Position,_std::allocator<Position>_> blue_insert;
  
  local_68 = (vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
              *)&this->yellow_eq;
  local_60 = (vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
              *)&this->red_eq;
  local_70 = (vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
              *)&this->green_eq;
  (this->green_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->green_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->red_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->green_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->red_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->red_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->yellow_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->yellow_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blue_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->yellow_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blue_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blue_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = 0;
  local_a4 = 1;
  local_90 = 0;
  local_58 = this;
  do {
    if (local_90 == 4) {
      return;
    }
    local_a8 = 6 - local_90;
    local_ac = 5 - local_90;
    local_b0 = 4 - local_90;
    local_94 = 3 - local_90;
    uVar2 = 0;
    for (local_8c = 0; local_a4 != local_8c; local_8c = local_8c + 1) {
      iVar3 = 3;
      iVar1 = local_94;
      switch(local_8c) {
      case 0:
        break;
      case 1:
        iVar1 = local_b0;
        break;
      case 2:
        iVar1 = local_b0;
        goto LAB_00107b8a;
      case 3:
        iVar1 = local_ac;
LAB_00107b8a:
        iVar3 = 2;
        break;
      case 4:
        iVar1 = local_ac;
        goto LAB_00107ba7;
      case 5:
        iVar1 = local_a8;
LAB_00107ba7:
        iVar3 = 1;
        break;
      case 6:
        iVar3 = 0;
        iVar1 = local_a8;
        break;
      default:
        puts("Invalid position");
        iVar3 = local_cc;
        iVar1 = unaff_R15D;
      }
      iVar5 = (int)local_a0 + (int)uVar2;
      iVar4 = (int)uVar2 + iVar1 * 2;
      local_88.reference_corner = R;
      local_7c = 1;
      __l._M_len = 2;
      __l._M_array = &local_88;
      local_88.layer = iVar3;
      local_88.entry = iVar5;
      local_78 = iVar1;
      local_74 = iVar4;
      local_50 = uVar2;
      std::vector<Position,_std::allocator<Position>_>::vector
                (&blue_insert,__l,(allocator_type *)&local_c8);
      local_c8.reference_corner = R;
      local_bc = 1;
      __l_00._M_len = 2;
      __l_00._M_array = &local_c8;
      local_cc = iVar3;
      local_c8.layer = iVar3;
      local_c8.entry = iVar5;
      local_b8 = iVar1;
      local_b4 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector
                ((vector<Position,_std::allocator<Position>_> *)&local_88,__l_00,&local_cd);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>
                ((vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
                  *)local_58,(vector<Position,_std::allocator<Position>_> *)&local_88);
      std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
                ((_Vector_base<Position,_std::allocator<Position>_> *)&local_88);
      local_c8.reference_corner = L;
      local_c8.layer = local_cc;
      local_bc = 3;
      __l_01._M_len = 2;
      __l_01._M_array = &local_c8;
      local_c8.entry = iVar5;
      local_b8 = iVar1;
      local_b4 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector
                ((vector<Position,_std::allocator<Position>_> *)&local_88,__l_01,&local_cd);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>
                (local_60,(vector<Position,_std::allocator<Position>_> *)&local_88);
      std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
                ((_Vector_base<Position,_std::allocator<Position>_> *)&local_88);
      local_c8.reference_corner = B;
      local_c8.layer = local_cc;
      local_bc = 2;
      __l_02._M_len = 2;
      __l_02._M_array = &local_c8;
      local_c8.entry = iVar5;
      local_b8 = iVar1;
      local_b4 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector
                ((vector<Position,_std::allocator<Position>_> *)&local_88,__l_02,&local_cd);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>
                (local_68,(vector<Position,_std::allocator<Position>_> *)&local_88);
      std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
                ((_Vector_base<Position,_std::allocator<Position>_> *)&local_88);
      local_c8.reference_corner = L;
      local_c8.layer = local_cc;
      local_bc = 2;
      __l_03._M_len = 2;
      __l_03._M_array = &local_c8;
      local_c8.entry = iVar5;
      local_b8 = iVar1;
      local_b4 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector
                ((vector<Position,_std::allocator<Position>_> *)&local_88,__l_03,&local_cd);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>
                (local_70,(vector<Position,_std::allocator<Position>_> *)&local_88);
      std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
                ((_Vector_base<Position,_std::allocator<Position>_> *)&local_88);
      std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
                (&blue_insert.super__Vector_base<Position,_std::allocator<Position>_>);
      uVar2 = (ulong)((int)local_50 - 1);
      unaff_R15D = iVar1;
    }
    local_90 = local_90 + 1;
    local_a4 = local_a4 + 2;
    local_a0 = (ulong)((int)local_a0 + 2);
  } while( true );
}

Assistant:

Eq_Pos_Table::Eq_Pos_Table(){
    // Build the equivalent position tables
    for(int layer = 0; layer < 4; layer++){
        for(int entry = 0;  entry < (2*layer + 1); entry++){
            //int flat_entry = (layer*layer) + entry;
            Position eq1, eq2;
            switch (entry)
            {
            case 0:
                eq1.layer = 3;
                eq2.layer = 3-layer;
                break;
            case 1:
                eq1.layer = 3;
                eq2.layer = 4-layer;
                break;
            case 2:
                eq1.layer = 2;
                eq2.layer = 4-layer;
                break;
            case 3:
                eq1.layer = 2;
                eq2.layer = 5-layer;
                break;
            case 4:
                eq1.layer = 1;
                eq2.layer = 5-layer;
                break;
            case 5:
                eq1.layer = 1;
                eq2.layer = 6-layer;
                break;
            case 6:
                eq1.layer = 0;
                eq2.layer = 6-layer;
                break;
            default:
                printf("Invalid position\n");
                break;
            }
            eq1.entry = 2*layer  - entry;
            eq2.entry = 2*(eq2.layer)  - entry;

            
            eq1.reference_corner = Corner::R;
            eq2.reference_corner = Corner::L;
            std::vector<Position> blue_insert{eq1, eq2};
            blue_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::L;
            eq2.reference_corner = Corner::B;
            red_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::B;
            eq2.reference_corner = Corner::R;
            yellow_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::L;
            eq2.reference_corner = Corner::R;
            green_eq.push_back(std::vector<Position>{eq1, eq2});
        }
    }
}